

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

rb_node * rb_prev(rb_node *rbn)

{
  bool bVar1;
  rb_node *local_10;
  rb_node *rbn_local;
  
  if (rbn->left == (rb_node *)0x0) {
    local_10 = rbn;
    if ((rbn->parent == (rb_node *)0x0) || (rbn != rbn->parent->right)) {
      while( true ) {
        bVar1 = false;
        if (local_10->parent != (rb_node *)0x0) {
          bVar1 = local_10 == local_10->parent->left;
        }
        if (!bVar1) break;
        local_10 = local_10->parent;
      }
      local_10 = local_10->parent;
    }
    else {
      local_10 = rbn->parent;
    }
  }
  else {
    for (local_10 = rbn->left; local_10->right != (rb_node *)0x0; local_10 = local_10->right) {
    }
  }
  return local_10;
}

Assistant:

static struct rb_node *
rb_prev(struct rb_node *rbn)
{
    if (RBN_LEFT(rbn)) {
        rbn = RBN_LEFT(rbn);
        while (RBN_RIGHT(rbn)) {
            rbn = RBN_RIGHT(rbn);
        }
    } else {
        if (RBN_PARENT(rbn) && (rbn == RBN_RIGHT(RBN_PARENT(rbn)))) {
            rbn = RBN_PARENT(rbn);
        } else {
            while (RBN_PARENT(rbn) &&
                    (rbn == RBN_LEFT(RBN_PARENT(rbn)))) {
                rbn = RBN_PARENT(rbn);
            }
            rbn = RBN_PARENT(rbn);
        }
    }

    return rbn;
}